

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int luaopen_string(lua_State *L)

{
  uint64_t uVar1;
  GCtab *t;
  TValue *pTVar2;
  
  lj_lib_register(L,"string",lj_lib_init_string,lj_lib_cf_string);
  t = lj_tab_new(L,0,1);
  uVar1 = (L->glref).ptr64;
  *(GCtab **)(uVar1 + 0x278) = t;
  pTVar2 = lj_tab_setstr(L,t,*(GCstr **)(uVar1 + 0x1a8));
  pTVar2->u64 = L->top[-1].u64 & 0x7fffffffffff | 0xfffa000000000000;
  t->nomm = 0xfe;
  lj_lib_prereg(L,"string.buffer",luaopen_string_buffer,(GCtab *)(L->top[-1].u64 & 0x7fffffffffff));
  return 1;
}

Assistant:

LUALIB_API int luaopen_string(lua_State *L)
{
  GCtab *mt;
  global_State *g;
  LJ_LIB_REG(L, LUA_STRLIBNAME, string);
  mt = lj_tab_new(L, 0, 1);
  /* NOBARRIER: basemt is a GC root. */
  g = G(L);
  setgcref(basemt_it(g, LJ_TSTR), obj2gco(mt));
  settabV(L, lj_tab_setstr(L, mt, mmname_str(g, MM_index)), tabV(L->top-1));
  mt->nomm = (uint8_t)(~(1u<<MM_index));
#if LJ_HASBUFFER
  lj_lib_prereg(L, LUA_STRLIBNAME ".buffer", luaopen_string_buffer, tabV(L->top-1));
#endif
  return 1;
}